

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseFile(Parser *this,TextFile *file,bool virtualFile)

{
  undefined1 uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  byte in_CL;
  undefined7 in_register_00000011;
  TextFile *this_00;
  undefined1 local_160 [8];
  FileTokenizer tokenizer;
  bool virtualFile_local;
  TextFile *file_local;
  Parser *this_local;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *result;
  
  this_00 = (TextFile *)CONCAT71(in_register_00000011,virtualFile);
  tokenizer._311_1_ = in_CL & 1;
  FileTokenizer::FileTokenizer((FileTokenizer *)local_160);
  uVar3 = FileTokenizer::init((FileTokenizer *)local_160,(EVP_PKEY_CTX *)this_00);
  uVar1 = tokenizer._311_1_;
  if ((uVar3 & 1) == 0) {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
               (nullptr_t)0x0);
  }
  else {
    TextFile::getFileName(this_00);
    parse(this,(Tokenizer *)file,SUB81(local_160,0),(path *)(ulong)((byte)uVar1 & 1));
    bVar2 = TextFile::isFromMemory(this_00);
    if (!bVar2) {
      iVar4 = TextFile::getNumLines(this_00);
      Global.FileInfo.TotalLineCount = iVar4 + Global.FileInfo.TotalLineCount;
    }
  }
  FileTokenizer::~FileTokenizer((FileTokenizer *)local_160);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseFile(TextFile& file, bool virtualFile)
{
	FileTokenizer tokenizer;
	if (!tokenizer.init(&file))
		return nullptr;

	std::unique_ptr<CAssemblerCommand> result = parse(&tokenizer,virtualFile,file.getFileName());

	if (!file.isFromMemory())
		Global.FileInfo.TotalLineCount += file.getNumLines();

	return result;
}